

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall aiMetadata::Set<double>(aiMetadata *this,uint index,string *key,double *value)

{
  aiMetadataType aVar1;
  ulong uVar2;
  double *pdVar3;
  double *value_local;
  string *key_local;
  uint index_local;
  aiMetadata *this_local;
  
  if (index < this->mNumProperties) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      aiString::operator=(this->mKeys + index,key);
      aVar1 = GetAiType(*value);
      this->mValues[index].mType = aVar1;
      pdVar3 = (double *)operator_new(8);
      *pdVar3 = *value;
      this->mValues[index].mData = pdVar3;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline 
    bool Set( unsigned index, const std::string& key, const T& value ) {
        // In range assertion
        if ( index >= mNumProperties ) {
            return false;
        }

        // Ensure that we have a valid key.
        if ( key.empty() ) {
            return false;
        }

        // Set metadata key
        mKeys[index] = key;

        // Set metadata type
        mValues[index].mType = GetAiType(value);
        // Copy the given value to the dynamic storage
        mValues[index].mData = new T(value);

        return true;
    }